

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

shared_ptr<kratos::Expr> __thiscall kratos::util::mux(util *this,Var *cond,Var *left,int64_t right)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  undefined1 auVar2 [8];
  element_type *this_00;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pair<std::__detail::_Node_iterator<std::shared_ptr<kratos::Expr>,_true,_false>,_bool> pVar5;
  shared_ptr<kratos::Expr> sVar6;
  shared_ptr<kratos::Var> local_58;
  undefined1 local_48 [8];
  shared_ptr<kratos::ConditionalExpr> expr;
  pointer local_30;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &cond->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &left->super_enable_shared_from_this<kratos::Var>);
  ConditionalExpr::create
            ((ConditionalExpr *)local_48,
             (shared_ptr<kratos::Var> *)
             &expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_58,right);
  if (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_30 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  auVar2 = local_48;
  iVar3 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)auVar2 + 0x200))->_vptr__Sp_counted_base =
       (_func_int **)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  this_00 = expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  if (expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_Expr).super_Var.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_Expr).super_Var.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  pVar5 = std::
          _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
                    ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)(CONCAT44(extraout_var_00,iVar3) + 400),
                     &expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  _Var4._M_pi = pVar5._8_8_;
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    _Var4._M_pi = extraout_RDX;
  }
  *(undefined1 (*) [8])this = local_48;
  *(undefined8 *)(this + 8) = 0;
  *(element_type **)(this + 8) =
       expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar6.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar6.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Expr>)
         sVar6.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> util::mux(Var &cond, Var &left, int64_t right) {
    auto expr = ConditionalExpr::create(cond.shared_from_this(), left.shared_from_this(), right);
    expr->set_generator(cond.generator());
    cond.generator()->add_expr(expr);
    return expr;
}